

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O1

int arkLSGetNumRhsEvals(void *arkode_mem,long *nfevalsLS)

{
  int iVar1;
  ARKLsMem arkls_mem;
  ARKodeMem ark_mem;
  ARKLsMem local_18;
  ARKodeMem local_10;
  
  iVar1 = arkLs_AccessLMem(arkode_mem,"arkLSGetNumRhsEvals",&local_10,&local_18);
  if (iVar1 == 0) {
    *nfevalsLS = local_18->nfeDQ;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int arkLSGetNumRhsEvals(void *arkode_mem, long int *nfevalsLS)
{
  ARKodeMem ark_mem;
  ARKLsMem  arkls_mem;
  int       retval;

  /* access ARKLsMem structure; set output value and return */
  retval = arkLs_AccessLMem(arkode_mem, "arkLSGetNumRhsEvals",
                            &ark_mem, &arkls_mem);
  if (retval != ARK_SUCCESS)  return(retval);
  *nfevalsLS = arkls_mem->nfeDQ;
  return(ARKLS_SUCCESS);
}